

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_4c0ed::DepsLogTestLotsOfDeps::Run(DepsLogTestLotsOfDeps *this)

{
  Test *pTVar1;
  bool bVar2;
  LoadStatus LVar3;
  Node *pNVar4;
  Deps *pDVar5;
  StringPiece local_400;
  Deps *local_3f0;
  Deps *log_deps;
  string local_3e0;
  undefined1 local_3c0 [8];
  DepsLog log2;
  State state2;
  Deps *log_deps_1;
  StringPiece local_230;
  Node *local_220;
  char local_218 [8];
  char buf [32];
  undefined1 local_1f0 [4];
  int i;
  vector<Node_*,_std::allocator<Node_*>_> deps;
  string local_1d0;
  undefined1 local_1b0 [8];
  string err;
  undefined1 local_180 [8];
  DepsLog log1;
  State state1;
  int kNumDeps;
  DepsLogTestLotsOfDeps *this_local;
  
  State::State((State *)&log1.deps_.
                         super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
  DepsLog::DepsLog((DepsLog *)local_180);
  std::__cxx11::string::string((string *)local_1b0);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"DepsLogTest-tempfile",
             (allocator<char> *)
             ((long)&deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  bVar2 = DepsLog::OpenForWrite((DepsLog *)local_180,&local_1d0,(string *)local_1b0);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
             ,0x62,"log1.OpenForWrite(kTestFilename, &err)");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  pTVar1 = g_current_test;
  bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1b0);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                     ,99,"\"\" == err");
  if (bVar2) {
    std::vector<Node_*,_std::allocator<Node_*>_>::vector
              ((vector<Node_*,_std::allocator<Node_*>_> *)local_1f0);
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    for (; (int)buf._28_4_ < 100000; buf._28_4_ = buf._28_4_ + 1) {
      sprintf(local_218,"file%d.h",(ulong)(uint)buf._28_4_);
      StringPiece::StringPiece(&local_230,local_218);
      local_220 = State::GetNode((State *)&log1.deps_.
                                           super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 local_230,0);
      std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                ((vector<Node_*,_std::allocator<Node_*>_> *)local_1f0,&local_220);
    }
    StringPiece::StringPiece((StringPiece *)&log_deps_1,"out.o");
    pNVar4 = State::GetNode((State *)&log1.deps_.
                                      super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,_log_deps_1
                            ,0);
    DepsLog::RecordDeps((DepsLog *)local_180,pNVar4,1,
                        (vector<Node_*,_std::allocator<Node_*>_> *)local_1f0);
    StringPiece::StringPiece
              ((StringPiece *)
               &state2.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,"out.o");
    pNVar4 = State::GetNode((State *)&log1.deps_.
                                      super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            stack0xfffffffffffffda8,0);
    pDVar5 = DepsLog::GetDeps((DepsLog *)local_180,pNVar4);
    bVar2 = testing::Test::Check
                      (g_current_test,pDVar5->node_count == 100000,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                       ,0x6f,"kNumDeps == log_deps->node_count");
    if (!bVar2) {
      testing::Test::AddAssertionFailure(g_current_test);
    }
    deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._1_3_ = 0;
    deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_1_ = !bVar2;
    std::vector<Node_*,_std::allocator<Node_*>_>::~vector
              ((vector<Node_*,_std::allocator<Node_*>_> *)local_1f0);
    if ((uint)deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage == 0) {
      DepsLog::Close((DepsLog *)local_180);
      State::State((State *)&log2.deps_.
                             super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
      DepsLog::DepsLog((DepsLog *)local_3c0);
      pTVar1 = g_current_test;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3e0,"DepsLogTest-tempfile",
                 (allocator<char> *)((long)&log_deps + 7));
      LVar3 = DepsLog::Load((DepsLog *)local_3c0,&local_3e0,
                            (State *)&log2.deps_.
                                      super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (string *)local_1b0);
      testing::Test::Check
                (pTVar1,LVar3 != LOAD_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                 ,0x76,"log2.Load(kTestFilename, &state2, &err)");
      std::__cxx11::string::~string((string *)&local_3e0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&log_deps + 7));
      pTVar1 = g_current_test;
      bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1b0);
      bVar2 = testing::Test::Check
                        (pTVar1,bVar2,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                         ,0x77,"\"\" == err");
      if (bVar2) {
        StringPiece::StringPiece(&local_400,"out.o");
        pNVar4 = State::GetNode((State *)&log2.deps_.
                                          super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                local_400,0);
        local_3f0 = DepsLog::GetDeps((DepsLog *)local_3c0,pNVar4);
        bVar2 = testing::Test::Check
                          (g_current_test,local_3f0->node_count == 100000,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/deps_log_test.cc"
                           ,0x7a,"kNumDeps == log_deps->node_count");
        if (bVar2) {
          deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._0_4_ = 0;
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
          deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._0_4_ = 1;
        }
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ = 1;
      }
      DepsLog::~DepsLog((DepsLog *)local_3c0);
      State::~State((State *)&log2.deps_.
                              super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
    deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_1b0);
  DepsLog::~DepsLog((DepsLog *)local_180);
  State::~State((State *)&log1.deps_.
                          super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST_F(DepsLogTest, LotsOfDeps) {
  const int kNumDeps = 100000;  // More than 64k.

  State state1;
  DepsLog log1;
  string err;
  EXPECT_TRUE(log1.OpenForWrite(kTestFilename, &err));
  ASSERT_EQ("", err);

  {
    vector<Node*> deps;
    for (int i = 0; i < kNumDeps; ++i) {
      char buf[32];
      sprintf(buf, "file%d.h", i);
      deps.push_back(state1.GetNode(buf, 0));
    }
    log1.RecordDeps(state1.GetNode("out.o", 0), 1, deps);

    DepsLog::Deps* log_deps = log1.GetDeps(state1.GetNode("out.o", 0));
    ASSERT_EQ(kNumDeps, log_deps->node_count);
  }

  log1.Close();

  State state2;
  DepsLog log2;
  EXPECT_TRUE(log2.Load(kTestFilename, &state2, &err));
  ASSERT_EQ("", err);

  DepsLog::Deps* log_deps = log2.GetDeps(state2.GetNode("out.o", 0));
  ASSERT_EQ(kNumDeps, log_deps->node_count);
}